

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::OnBlock(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result RVar1;
  
  RVar1 = PopAndCheckSignature(this,param_types,"block");
  PushLabel(this,Block,param_types,result_types);
  PushTypes(this,param_types);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnBlock(const TypeVector& param_types,
                            const TypeVector& result_types) {
  Result result = PopAndCheckSignature(param_types, "block");
  PushLabel(LabelType::Block, param_types, result_types);
  PushTypes(param_types);
  return result;
}